

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc_none.c
# Opt level: O0

void mbc_none_write(gb_cart *cart,uint16_t addr,uint8_t byte)

{
  ushort uVar1;
  uint8_t byte_local;
  uint16_t addr_local;
  gb_cart *cart_local;
  
  if (cart == (gb_cart *)0x0) {
    __assert_fail("cart != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc_none.c"
                  ,0x2e,"void mbc_none_write(struct gb_cart *, uint16_t, uint8_t)");
  }
  uVar1 = addr & 0xf000;
  if (((((((addr & 0xf000) != 0) && (uVar1 != 0x1000)) && (uVar1 != 0x2000)) &&
       ((uVar1 != 0x3000 && (uVar1 != 0x4000)))) &&
      ((uVar1 != 0x5000 && ((uVar1 != 0x6000 && (uVar1 != 0x7000)))))) &&
     ((uVar1 == 0xa000 || (uVar1 == 0xb000)))) {
    cart->ram[(int)(addr - 0xa000)] = byte;
  }
  return;
}

Assistant:

void mbc_none_write(struct gb_cart *cart, uint16_t addr, uint8_t byte)
{
    assert(cart != NULL);

    switch (addr & 0xF000)
    {
    case 0x0000:
    case 0x1000:
    case 0x2000:
    case 0x3000:
    case 0x4000:
    case 0x5000:
    case 0x6000:
    case 0x7000:
        // ROM writing is not allowed
        break;

    case 0xA000:
    case 0xB000:
        // External RAM
        cart->ram[addr - 0xA000] = byte;
        break;
    
    default:
        break;
    }
}